

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.cpp
# Opt level: O2

void mbedtls_ct_memcpy_offset
               (uchar *dest,uchar *src,size_t offset,size_t offset_min,size_t offset_max,size_t len)

{
  mbedtls_ct_condition_t condition;
  
  for (; offset_min <= offset_max; offset_min = offset_min + 1) {
    condition = mbedtls_ct_uint_eq(offset_min,offset);
    mbedtls_ct_memcpy_if(condition,dest,src + offset_min,(uchar *)0x0,len);
  }
  return;
}

Assistant:

void mbedtls_ct_memcpy_offset(unsigned char *dest,
                              const unsigned char *src,
                              size_t offset,
                              size_t offset_min,
                              size_t offset_max,
                              size_t len)
{
    size_t offsetval;

    for (offsetval = offset_min; offsetval <= offset_max; offsetval++) {
        mbedtls_ct_memcpy_if(mbedtls_ct_uint_eq(offsetval, offset), dest, src + offsetval, NULL,
                             len);
    }
}